

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlGetLastChild(xmlNode *parent)

{
  if ((parent != (xmlNode *)0x0) && (parent->type != XML_NAMESPACE_DECL)) {
    return parent->last;
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlGetLastChild(const xmlNode *parent) {
    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlGetLastChild : parent == NULL\n");
#endif
	return(NULL);
    }
    return(parent->last);
}